

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmain.cc
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  double dVar5;
  Api midi_api;
  Api audio_api;
  double local_80;
  double latency;
  int c;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char *local_20;
  char *home_dir;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  home_dir = (char *)argv;
  argv_local._0_4_ = argc;
  i18n_setup();
  Midi_Db::init(&midi_db,(EVP_PKEY_CTX *)argv);
  pcVar4 = getenv("HOME");
  local_20 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,pcVar4,&local_61);
    std::operator+(&local_40,&local_60,"/.config/adlrt.conf");
    std::__cxx11::string::operator=((string *)&arg_config_file_abi_cxx11_,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  do {
    latency._0_4_ = generic_getopt((int)argv_local,(char **)home_dir,"L:A:M:C",usage);
    pcVar4 = _optarg;
    if (latency._0_4_ == -1) {
      if ((int)argv_local != _optind) {
        return 1;
      }
      load_config();
      openlog("ADLrt",0,8);
      handle_signals();
      iVar3 = audio_main();
      return iVar3;
    }
    switch(latency._0_4_) {
    case 0x41:
      arg_audio_api = find_audio_api(_optarg);
      bVar2 = is_compiled_audio_api(arg_audio_api);
      pFVar1 = _stderr;
      if (!bVar2) {
        pcVar4 = _("Invalid audio system \'%s\'.\n");
        fprintf(pFVar1,pcVar4,_optarg);
        return 1;
      }
      break;
    default:
      usage();
      return 1;
    case 0x43:
      std::__cxx11::string::operator=((string *)&arg_config_file_abi_cxx11_,_optarg);
      break;
    case 0x4c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&audio_api,pcVar4,(allocator *)((long)&midi_api + 3));
      dVar5 = std::__cxx11::stod((string *)&audio_api,(size_t *)0x0);
      dVar5 = dVar5 * 0.001;
      arg_latency = dVar5;
      std::__cxx11::string::~string((string *)&audio_api);
      std::allocator<char>::~allocator((allocator<char> *)((long)&midi_api + 3));
      pFVar1 = _stderr;
      local_80 = dVar5;
      if (dVar5 <= 0.0) {
        pcVar4 = _("Invalid latency.");
        fprintf(pFVar1,"%s\n",pcVar4);
        return 1;
      }
      break;
    case 0x4d:
      arg_midi_api = find_midi_api(_optarg);
      bVar2 = is_compiled_midi_api(arg_midi_api);
      pFVar1 = _stderr;
      if (!bVar2) {
        pcVar4 = _("Invalid MIDI system \'%s\'.\n");
        fprintf(pFVar1,pcVar4,_optarg);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    i18n_setup();
    midi_db.init();

    char *home_dir = getenv("HOME");
    if (home_dir) {
        arg_config_file = std::string(home_dir) + "/.config/adlrt.conf";
    }

    for (int c; (c = generic_getopt(argc, argv, "L:A:M:C", usage)) != -1;) {
        switch (c) {
        case 'C' : {
            ::arg_config_file = optarg;
            break;
        }
        case 'L': {
            double latency = ::arg_latency = std::stod(optarg) * 1e-3;
            if (latency <= 0) {
                fprintf(stderr, "%s\n", _("Invalid latency."));
                return 1;
            }
            break;
        }
        case 'A': {
            RtAudio::Api audio_api = ::arg_audio_api = find_audio_api(optarg);
            if (!is_compiled_audio_api(audio_api)) {
                fprintf(stderr, _("Invalid audio system '%s'.\n"), optarg);
                return 1;
            }
            break;
        }
        case 'M': {
            RtMidi::Api midi_api = ::arg_midi_api = find_midi_api(optarg);
            if (!is_compiled_midi_api(midi_api)) {
                fprintf(stderr, _("Invalid MIDI system '%s'.\n"), optarg);
                return 1;
            }
            break;
        }
        default:
            usage();
            return 1;
        }
    }

    if (argc != optind)
        return 1;

    load_config();

#ifdef ADLJACK_GTK3
    gtk_init(&argc, &argv);
#endif

#if !defined(_WIN32)
    openlog("ADLrt", 0, LOG_USER);
#endif

    handle_signals();
    return audio_main();
}